

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O2

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  MPSegment *this_00;
  Rune *value;
  uint __line;
  bool bVar1;
  size_type __n;
  ulong uVar2;
  char *__assertion;
  undefined7 in_register_00000081;
  ulong uVar3;
  size_t k;
  long lVar4;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> words;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> hmmRes;
  
  if ((int)CONCAT71(in_register_00000081,hmm) == 0) {
    MPSegment::Cut(&this->mpSeg_,begin,end,res,0x200);
    return;
  }
  words.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  words.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (begin <= end) {
    __n = ((long)end - (long)begin) / 0x14;
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve(&words,__n);
    this_00 = &this->mpSeg_;
    MPSegment::Cut(this_00,begin,end,&words,0x200);
    hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve(&hmmRes,__n);
    uVar3 = 0;
    do {
      if ((ulong)((long)words.
                        super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)words.
                        super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar3) {
        std::_Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~_Vector_base
                  (&hmmRes.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>);
        std::_Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~_Vector_base
                  (&words.
                    super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>);
        return;
      }
      lVar4 = uVar3 * 0x10;
      if ((words.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar3].left !=
           words.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar3].right) ||
         (bVar1 = MPSegment::IsUserDictSingleChineseWord
                            (this_00,&(words.
                                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar3].left)->rune)
         , uVar2 = uVar3, bVar1)) {
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                  (res,words.
                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar3);
        uVar2 = uVar3;
      }
      else {
        while (((uVar2 < (ulong)((long)words.
                                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)words.
                                       super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 4) &&
                (value = *(Rune **)((long)&(words.
                                            super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->left + lVar4
                                   ),
                value == *(Rune **)((long)&(words.
                                            super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->right +
                                   lVar4))) &&
               (bVar1 = MPSegment::IsUserDictSingleChineseWord(this_00,value), !bVar1))) {
          lVar4 = lVar4 + 0x10;
          uVar2 = uVar2 + 1;
        }
        uVar2 = uVar2 - 1;
        if (uVar2 < uVar3) {
          __assertion = "j - 1 >= i";
          __line = 0x48;
          goto LAB_0011dc67;
        }
        HMMSegment::Cut(&this->hmmSeg_,
                        words.
                        super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar3].left,
                        (const_iterator)
                        (*(long *)((long)&words.
                                          super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].left + lVar4
                                  ) + 0x14),&hmmRes);
        lVar4 = 0;
        for (uVar3 = 0;
            uVar3 < (ulong)((long)hmmRes.
                                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)hmmRes.
                                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1
            ) {
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (res,(value_type *)
                         ((long)&(hmmRes.
                                  super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->left + lVar4));
          lVar4 = lVar4 + 0x10;
        }
        if (hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               hmmRes.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar3 = uVar2 + 1;
    } while( true );
  }
  __assertion = "end >= begin";
  __line = 0x34;
LAB_0011dc67:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/MixSegment.hpp"
                ,__line,
                "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
               );
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    if (!hmm) {
      mpSeg_.Cut(begin, end, res);
      return;
    }
    vector<WordRange> words;
    assert(end >= begin);
    words.reserve(end - begin);
    mpSeg_.Cut(begin, end, words);

    vector<WordRange> hmmRes;
    hmmRes.reserve(end - begin);
    for (size_t i = 0; i < words.size(); i++) {
      //if mp Get a word, it's ok, put it into result
      if (words[i].left != words[i].right || (words[i].left == words[i].right && mpSeg_.IsUserDictSingleChineseWord(words[i].left->rune))) {
        res.push_back(words[i]);
        continue;
      }

      // if mp Get a single one and it is not in userdict, collect it in sequence
      size_t j = i;
      while (j < words.size() && words[j].left == words[j].right && !mpSeg_.IsUserDictSingleChineseWord(words[j].left->rune)) {
        j++;
      }

      // Cut the sequence with hmm
      assert(j - 1 >= i);
      // TODO
      hmmSeg_.Cut(words[i].left, words[j - 1].left + 1, hmmRes);
      //put hmm result to result
      for (size_t k = 0; k < hmmRes.size(); k++) {
        res.push_back(hmmRes[k]);
      }

      //clear tmp vars
      hmmRes.clear();

      //let i jump over this piece
      i = j - 1;
    }
  }